

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O2

base_uint<256U> * __thiscall base_uint<256U>::operator*=(base_uint<256U> *this,uint32_t b32)

{
  long lVar1;
  int i;
  long lVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    uVar3 = (ulong)this->pn[lVar2] * (ulong)b32 + uVar3;
    this->pn[lVar2] = (uint32_t)uVar3;
    uVar3 = uVar3 >> 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator*=(uint32_t b32)
{
    uint64_t carry = 0;
    for (int i = 0; i < WIDTH; i++) {
        uint64_t n = carry + (uint64_t)b32 * pn[i];
        pn[i] = n & 0xffffffff;
        carry = n >> 32;
    }
    return *this;
}